

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

void tcu::lookupQuad(ColorQuad *dst,ConstPixelBufferAccess *level,Sampler *sampler,int x0,int x1,
                    int y0,int y1,int z)

{
  undefined8 local_40;
  undefined8 uStack_38;
  
  lookup<float>((tcu *)&local_40,level,sampler,x0,y0,z);
  *(undefined8 *)(dst->p00).m_data = local_40;
  *(undefined8 *)((dst->p00).m_data + 2) = uStack_38;
  lookup<float>((tcu *)&local_40,level,sampler,x1,y0,z);
  *(undefined8 *)(dst->p10).m_data = local_40;
  *(undefined8 *)((dst->p10).m_data + 2) = uStack_38;
  lookup<float>((tcu *)&local_40,level,sampler,x0,y1,z);
  *(undefined8 *)(dst->p01).m_data = local_40;
  *(undefined8 *)((dst->p01).m_data + 2) = uStack_38;
  lookup<float>((tcu *)&local_40,level,sampler,x1,y1,z);
  *(undefined8 *)(dst->p11).m_data = local_40;
  *(undefined8 *)((dst->p11).m_data + 2) = uStack_38;
  return;
}

Assistant:

static void lookupQuad (ColorQuad& dst, const ConstPixelBufferAccess& level, const Sampler& sampler, int x0, int x1, int y0, int y1, int z)
{
	dst.p00	= lookup<float>(level, sampler, x0, y0, z);
	dst.p10	= lookup<float>(level, sampler, x1, y0, z);
	dst.p01	= lookup<float>(level, sampler, x0, y1, z);
	dst.p11	= lookup<float>(level, sampler, x1, y1, z);
}